

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int CVmObjGramProd::tok_equals_lit
              (vmgramprod_tok *tok,char *lit,size_t lit_len,CVmObjDict *dict,vm_val_t *result_val)

{
  int iVar1;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  vm_val_t *in_R8;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  vm_val_t *in_stack_00000060;
  CVmObjDict *in_stack_00000068;
  vm_val_t *in_stack_00000080;
  bool local_31;
  int local_4;
  
  if (in_RCX == 0) {
    local_31 = false;
    if (*(size_t *)(in_RDI + 0x20) == in_RDX) {
      iVar1 = memcmp(*(void **)(in_RDI + 0x18),in_RSI,in_RDX);
      local_31 = iVar1 == 0;
    }
    vm_val_t::set_int(in_R8,(uint)local_31);
    local_4 = (in_R8->val).intval;
  }
  else {
    local_4 = CVmObjDict::match_strings
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                         in_stack_00000048,in_stack_00000040,in_stack_00000080);
  }
  return local_4;
}

Assistant:

int CVmObjGramProd::tok_equals_lit(VMG_ const struct vmgramprod_tok *tok,
                                   const char *lit, size_t lit_len,
                                   CVmObjDict *dict, vm_val_t *result_val)
{
    /* 
     *   if there's a dictionary, ask it to do the comparison; otherwise,
     *   use an exact literal match 
     */
    if (dict != 0)
    {
        /* ask the dictionary for the comparison */
        return dict->match_strings(vmg_ &tok->val_, tok->txt_, tok->len_,
                                   lit, lit_len, result_val);
    }
    else
    {
        /* perform an exact comparison */
        result_val->set_int(tok->len_ == lit_len
                            && memcmp(tok->txt_, lit, lit_len) == 0);
        return result_val->val.intval;
    }
}